

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-ft-raster.c
# Opt level: O2

void gray_render_cubic(PWorker worker,PVG_FT_Vector *control1,PVG_FT_Vector *control2,
                      PVG_FT_Vector *to)

{
  long lVar1;
  ulong uVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  long alStack_378 [5];
  PWorker local_350;
  PVG_FT_Vector bez_stack [49];
  
  lVar10 = to->x << 2;
  bez_stack[0].x = lVar10;
  lVar3 = to->y * 4;
  bez_stack[0].y = lVar3;
  bez_stack[1].x = control2->x << 2;
  bez_stack[1].y = control2->y << 2;
  bez_stack[2].x = control1->x << 2;
  bez_stack[2].y = control1->y << 2;
  bez_stack[3].x = worker->x;
  lVar4 = worker->y;
  bez_stack[3].y = lVar4;
  lVar1 = to->y >> 6;
  lVar15 = worker->max_ey;
  lVar5 = control2->y >> 6;
  lVar7 = control1->y >> 6;
  if (((lVar15 <= lVar5 && lVar15 <= lVar1) && (lVar15 <= lVar4 >> 8 && lVar15 <= lVar7)) ||
     (lVar15 = worker->min_ey,
     (lVar7 < lVar15 && (lVar5 < lVar15 && lVar1 < lVar15)) && lVar4 >> 8 < lVar15)) {
    worker->x = lVar10;
    worker->y = lVar3;
    return;
  }
  local_350 = worker;
  lVar15 = 0;
  alStack_378[3] = 2;
  do {
    lVar1 = *(long *)((long)&bez_stack[3].x + lVar15);
    uVar6 = lVar1 - lVar10;
    uVar2 = lVar4 - lVar3;
    uVar11 = -uVar6;
    if (0 < (long)uVar6) {
      uVar11 = uVar6;
    }
    uVar8 = -uVar2;
    if (0 < (long)uVar2) {
      uVar8 = uVar2;
    }
    if (uVar8 < uVar11) {
      uVar8 = uVar8 * 3 >> 3;
    }
    else {
      uVar11 = uVar11 * 3 >> 3;
    }
    if (uVar8 + uVar11 < 0x800000) {
      uVar13 = (uVar8 + uVar11) * 0x2a;
      lVar7 = *(long *)((long)&bez_stack[1].x + lVar15) - lVar10;
      lVar5 = *(long *)((long)&bez_stack[1].y + lVar15) - lVar3;
      uVar8 = lVar7 * uVar2 - lVar5 * uVar6;
      uVar11 = -uVar8;
      if (0 < (long)uVar8) {
        uVar11 = uVar8;
      }
      if (uVar13 < uVar11) goto LAB_0011ca79;
      lVar14 = *(long *)((long)&bez_stack[2].x + lVar15) - lVar10;
      lVar9 = *(long *)((long)&bez_stack[2].y + lVar15) - lVar3;
      uVar8 = lVar14 * uVar2 - lVar9 * uVar6;
      uVar11 = -uVar8;
      if (0 < (long)uVar8) {
        uVar11 = uVar8;
      }
      if (((uVar13 < uVar11) ||
          (lVar7 = (lVar7 - uVar6) * lVar7, lVar5 = (lVar5 - uVar2) * lVar5, lVar12 = lVar5 + lVar7,
          lVar12 != 0 && SCARRY8(lVar5,lVar7) == lVar12 < 0)) ||
         (lVar14 = (lVar14 - uVar6) * lVar14, lVar9 = (lVar9 - uVar2) * lVar9,
         lVar5 = lVar9 + lVar14, lVar5 != 0 && SCARRY8(lVar9,lVar14) == lVar5 < 0))
      goto LAB_0011ca79;
      alStack_378[3] = 0x11cb92;
      gray_render_line(local_350,lVar10,lVar3);
      if (lVar15 == 0) {
        return;
      }
      lVar10 = *(long *)((long)alStack_378 + lVar15);
      lVar15 = lVar15 + -0x30;
    }
    else {
LAB_0011ca79:
      if (lVar15 == 0x2d0) {
        return;
      }
      *(long *)((long)&bez_stack[6].x + lVar15) = lVar1;
      lVar5 = *(long *)((long)&bez_stack[2].x + lVar15);
      lVar7 = *(long *)((long)&bez_stack[1].x + lVar15);
      lVar9 = *(long *)((long)&bez_stack[1].y + lVar15);
      lVar10 = (lVar10 + lVar7) / 2;
      *(long *)((long)&bez_stack[1].x + lVar15) = lVar10;
      lVar1 = (lVar1 + lVar5) / 2;
      *(long *)((long)&bez_stack[5].x + lVar15) = lVar1;
      lVar5 = (lVar5 + lVar7) / 2;
      lVar10 = (lVar10 + lVar5) / 2;
      *(long *)((long)&bez_stack[2].x + lVar15) = lVar10;
      lVar1 = (lVar1 + lVar5) / 2;
      *(long *)((long)&bez_stack[4].x + lVar15) = lVar1;
      lVar10 = (lVar1 + lVar10) / 2;
      *(long *)((long)&bez_stack[3].x + lVar15) = lVar10;
      *(long *)((long)&bez_stack[6].y + lVar15) = lVar4;
      lVar1 = *(long *)((long)&bez_stack[2].y + lVar15);
      lVar3 = (lVar3 + lVar9) / 2;
      *(long *)((long)&bez_stack[1].y + lVar15) = lVar3;
      lVar4 = (lVar4 + lVar1) / 2;
      *(long *)((long)&bez_stack[5].y + lVar15) = lVar4;
      lVar1 = (lVar1 + lVar9) / 2;
      lVar3 = (lVar3 + lVar1) / 2;
      *(long *)((long)&bez_stack[2].y + lVar15) = lVar3;
      lVar4 = (lVar4 + lVar1) / 2;
      *(long *)((long)&bez_stack[4].y + lVar15) = lVar4;
      *(long *)((long)&bez_stack[3].y + lVar15) = (lVar4 + lVar3) / 2;
      lVar15 = lVar15 + 0x30;
    }
    lVar3 = *(long *)((long)&bez_stack[0].y + lVar15);
    lVar4 = *(long *)((long)&bez_stack[3].y + lVar15);
  } while( true );
}

Assistant:

static void
  gray_render_cubic( RAS_ARG_ const PVG_FT_Vector*  control1,
                              const PVG_FT_Vector*  control2,
                              const PVG_FT_Vector*  to )
  {
    PVG_FT_Vector   bez_stack[16 * 3 + 1];  /* enough to accommodate bisections */
    PVG_FT_Vector*  arc = bez_stack;
    PVG_FT_Vector*  limit = bez_stack + 45;
    TPos        dx, dy, dx_, dy_;
    TPos        dx1, dy1, dx2, dy2;
    TPos        L, s, s_limit;


    arc[0].x = UPSCALE( to->x );
    arc[0].y = UPSCALE( to->y );
    arc[1].x = UPSCALE( control2->x );
    arc[1].y = UPSCALE( control2->y );
    arc[2].x = UPSCALE( control1->x );
    arc[2].y = UPSCALE( control1->y );
    arc[3].x = ras.x;
    arc[3].y = ras.y;

    /* short-cut the arc that crosses the current band */
    if ( ( TRUNC( arc[0].y ) >= ras.max_ey &&
           TRUNC( arc[1].y ) >= ras.max_ey &&
           TRUNC( arc[2].y ) >= ras.max_ey &&
           TRUNC( arc[3].y ) >= ras.max_ey ) ||
         ( TRUNC( arc[0].y ) <  ras.min_ey &&
           TRUNC( arc[1].y ) <  ras.min_ey &&
           TRUNC( arc[2].y ) <  ras.min_ey &&
           TRUNC( arc[3].y ) <  ras.min_ey ) )
    {
      ras.x = arc[0].x;
      ras.y = arc[0].y;
      return;
    }

    for (;;)
    {
      /* Decide whether to split or draw. See `Rapid Termination          */
      /* Evaluation for Recursive Subdivision of Bezier Curves' by Thomas */
      /* F. Hain, at                                                      */
      /* http://www.cis.southalabama.edu/~hain/general/Publications/Bezier/Camera-ready%20CISST02%202.pdf */


      /* dx and dy are x and y components of the P0-P3 chord vector. */
      dx = dx_ = arc[3].x - arc[0].x;
      dy = dy_ = arc[3].y - arc[0].y;

      L = PVG_FT_HYPOT( dx_, dy_ );

      /* Avoid possible arithmetic overflow below by splitting. */
      if ( L >= (1 << 23) )
        goto Split;

      /* Max deviation may be as much as (s/L) * 3/4 (if Hain's v = 1). */
      s_limit = L * (TPos)( ONE_PIXEL / 6 );

      /* s is L * the perpendicular distance from P1 to the line P0-P3. */
      dx1 = arc[1].x - arc[0].x;
      dy1 = arc[1].y - arc[0].y;
      s = PVG_FT_ABS( dy * dx1 - dx * dy1 );

      if ( s > s_limit )
        goto Split;

      /* s is L * the perpendicular distance from P2 to the line P0-P3. */
      dx2 = arc[2].x - arc[0].x;
      dy2 = arc[2].y - arc[0].y;
      s = PVG_FT_ABS( dy * dx2 - dx * dy2 );

      if ( s > s_limit )
        goto Split;

      /* Split super curvy segments where the off points are so far
         from the chord that the angles P0-P1-P3 or P0-P2-P3 become
         acute as detected by appropriate dot products. */
      if ( dx1 * ( dx1 - dx ) + dy1 * ( dy1 - dy ) > 0 ||
           dx2 * ( dx2 - dx ) + dy2 * ( dy2 - dy ) > 0 )
        goto Split;

      gray_render_line( RAS_VAR_ arc[0].x, arc[0].y );

      if ( arc == bez_stack )
        return;

      arc -= 3;
      continue;

    Split:
      if( arc == limit )
        return;
      gray_split_cubic( arc );
      arc += 3;
    }
  }